

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  Message *pMVar4;
  char *__pattern;
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  char *regex_local;
  AssertionResult gtest_ar_;
  string local_40;
  
  regex_local = regex;
  pcVar2 = strdup(regex);
  *(char **)this = pcVar2;
  sVar3 = strlen(regex);
  pcVar2 = (char *)operator_new__(sVar3 + 10);
  snprintf(pcVar2,sVar3 + 10,"^(%s)$",regex);
  iVar1 = regcomp((regex_t *)(this + 0x10),pcVar2,1);
  gtest_ar_.success_ = iVar1 == 0;
  this[8] = (RE)gtest_ar_.success_;
  if (gtest_ar_.success_) {
    __pattern = "()";
    if (*regex != '\0') {
      __pattern = regex;
    }
    iVar1 = regcomp((regex_t *)(this + 0x50),__pattern,1);
    this[8] = (RE)(iVar1 == 0);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar_.success_ = iVar1 == 0;
    if (gtest_ar_.success_) goto LAB_0012d189;
  }
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  Message::Message((Message *)&local_68);
  std::operator<<((ostream *)(local_68.ptr_ + 0x10),"Regular expression \"");
  pMVar4 = Message::operator<<((Message *)&local_68,&regex_local);
  pMVar4 = Message::operator<<(pMVar4,(char (*) [52])
                                      "\" is not a valid POSIX Extended regular expression.");
  GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"is_valid_","false","true",in_R9);
  AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock-gtest-all.cc"
             ,0x20d2,local_40._M_dataplus._M_p);
  AssertHelper::operator=(&local_60,pMVar4);
  AssertHelper::~AssertHelper(&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_68);
LAB_0012d189:
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  operator_delete__(pcVar2);
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = posix::StrDup(regex);

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, REG_EXTENDED) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, REG_EXTENDED) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}